

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSwitch.c
# Opt level: O2

float Map_SwitchCutRefDeref(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,int fReference)

{
  int *piVar1;
  int iVar2;
  Map_Node_t *pNode_00;
  char cVar3;
  uint fPhase_00;
  int iVar4;
  Map_Cut_t *pCut_00;
  long lVar5;
  float fVar6;
  float local_2c;
  
  local_2c = pNode->Switching;
  cVar3 = pCut->nLeaves;
  if (cVar3 != '\x01') {
    if (pCut->M[fPhase].pSuperBest == (Map_Super_t *)0x0) {
      __assert_fail("pCut->M[fPhase].pSuperBest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperSwitch.c"
                    ,0x71,"float Map_SwitchCutRefDeref(Map_Node_t *, Map_Cut_t *, int, int)");
    }
    for (lVar5 = 0; lVar5 < cVar3; lVar5 = lVar5 + 1) {
      pNode_00 = pCut->ppLeaves[lVar5];
      fPhase_00 = Map_CutGetLeafPhase(pCut,fPhase,(int)lVar5);
      if (fReference == 0) {
        if ((pNode_00->pCutBest[0] == (Map_Cut_t *)0x0) ||
           (pNode_00->pCutBest[1] == (Map_Cut_t *)0x0)) {
          piVar1 = pNode_00->nRefAct + (int)fPhase_00;
          *piVar1 = *piVar1 + -1;
          if ((*piVar1 == 0) && (pNode_00->pCutBest[(int)fPhase_00] == (Map_Cut_t *)0x0)) {
            local_2c = local_2c + pNode_00->Switching;
          }
          iVar4 = pNode_00->nRefAct[2];
          pNode_00->nRefAct[2] = iVar4 + -1;
          if (iVar4 < 2) {
            iVar4 = pNode_00->nRefAct[(int)fPhase_00];
            goto LAB_002feb72;
          }
        }
        else {
          pNode_00->nRefAct[2] = pNode_00->nRefAct[2] + -1;
          iVar2 = pNode_00->nRefAct[(int)fPhase_00];
          iVar4 = iVar2 + -1;
          pNode_00->nRefAct[(int)fPhase_00] = iVar4;
          if (iVar2 < 2) {
LAB_002feb72:
            if (iVar4 < 0) {
              __assert_fail("pNodeChild->nRefAct[fPhaseChild] >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperSwitch.c"
                            ,0x9f,"float Map_SwitchCutRefDeref(Map_Node_t *, Map_Cut_t *, int, int)"
                           );
            }
            goto LAB_002feb76;
          }
        }
      }
      else {
        if ((pNode_00->pCutBest[0] == (Map_Cut_t *)0x0) ||
           (pNode_00->pCutBest[1] == (Map_Cut_t *)0x0)) {
          iVar4 = pNode_00->nRefAct[(int)fPhase_00];
          pNode_00->nRefAct[(int)fPhase_00] = iVar4 + 1;
          if ((iVar4 == 0) && (pNode_00->pCutBest[(int)fPhase_00] == (Map_Cut_t *)0x0)) {
            local_2c = local_2c + pNode_00->Switching;
          }
          iVar4 = pNode_00->nRefAct[2];
          pNode_00->nRefAct[2] = iVar4 + 1;
        }
        else {
          pNode_00->nRefAct[2] = pNode_00->nRefAct[2] + 1;
          iVar4 = pNode_00->nRefAct[(int)fPhase_00];
          pNode_00->nRefAct[(int)fPhase_00] = iVar4 + 1;
        }
        if (0 < iVar4) goto LAB_002febb0;
LAB_002feb76:
        pCut_00 = pNode_00->pCutBest[(int)fPhase_00];
        if (pCut_00 == (Map_Cut_t *)0x0) {
          pCut_00 = pNode_00->pCutBest[fPhase_00 == 0];
          fPhase_00 = (uint)(fPhase_00 == 0);
        }
        fVar6 = Map_SwitchCutRefDeref(pNode_00,pCut_00,fPhase_00,fReference);
        local_2c = local_2c + fVar6;
      }
LAB_002febb0:
      cVar3 = pCut->nLeaves;
    }
  }
  return local_2c;
}

Assistant:

float Map_SwitchCutRefDeref( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, int fReference )
{
    Map_Node_t * pNodeChild;
    Map_Cut_t * pCutChild;
    float aSwitchActivity;
    int i, fPhaseChild;

    // start switching activity for the node
    aSwitchActivity = pNode->Switching;
    // consider the elementary variable
    if ( pCut->nLeaves == 1 )
        return aSwitchActivity;

    // go through the children
    assert( pCut->M[fPhase].pSuperBest );
    for ( i = 0; i < pCut->nLeaves; i++ )
    {
        pNodeChild  = pCut->ppLeaves[i];
        fPhaseChild = Map_CutGetLeafPhase( pCut, fPhase, i );
        // get the reference counter of the child

        if ( fReference )
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                pNodeChild->nRefAct[2]++;
                if ( pNodeChild->nRefAct[fPhaseChild]++ > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( pNodeChild->nRefAct[fPhaseChild]++ == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aSwitchActivity += pNodeChild->Switching; // inverter switches the same as the node
                // if the node is referenced, there is no recursive call
                if ( pNodeChild->nRefAct[2]++ > 0 )
                    continue;
            }
        }
        else
        {
            if ( pNodeChild->pCutBest[0] && pNodeChild->pCutBest[1] ) // both phases are present
            {
                // if this phase of the node is referenced, there is no recursive call
                --pNodeChild->nRefAct[2];
                if ( --pNodeChild->nRefAct[fPhaseChild] > 0 )
                    continue;
            }
            else // only one phase is present
            {
                // inverter should be added if the phase
                // (a) has no reference and (b) is implemented using other phase
                if ( --pNodeChild->nRefAct[fPhaseChild] == 0 && pNodeChild->pCutBest[fPhaseChild] == NULL )
                    aSwitchActivity += pNodeChild->Switching; // inverter switches the same as the node
                // if the node is referenced, there is no recursive call
                if ( --pNodeChild->nRefAct[2] > 0 )
                    continue;
            }
            assert( pNodeChild->nRefAct[fPhaseChild] >= 0 );
        }

        // get the child cut
        pCutChild = pNodeChild->pCutBest[fPhaseChild];
        // if the child does not have this phase mapped, take the opposite phase
        if ( pCutChild == NULL )
        {
            fPhaseChild = !fPhaseChild;
            pCutChild   = pNodeChild->pCutBest[fPhaseChild];
        }
        // reference and compute area recursively
        aSwitchActivity += Map_SwitchCutRefDeref( pNodeChild, pCutChild, fPhaseChild, fReference );
    }
    return aSwitchActivity;
}